

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4afdb9::DeleteExpr::printLeft(DeleteExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  
  if (this->IsGlobal == true) {
    R.Last = "";
    R.First = "::";
    OutputStream::operator+=(S,R);
  }
  R_00.Last = "";
  R_00.First = "delete";
  OutputStream::operator+=(S,R_00);
  if (this->IsArray == true) {
    R_01.Last = "";
    R_01.First = "[] ";
    OutputStream::operator+=(S,R_01);
  }
  Node::print(this->Op,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsGlobal)
      S += "::";
    S += "delete";
    if (IsArray)
      S += "[] ";
    Op->print(S);
  }